

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O0

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
::WorkerQueue(WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
              *this,int numWorkers,
             WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *args,Database<DNA> *args_1,SearchParams<DNA> *args_2)

{
  uint local_8c;
  type local_58;
  thread local_50;
  uint local_44;
  uint local_40;
  int i;
  uint actualWorkers;
  SearchParams<DNA> *local_30;
  SearchParams<DNA> *args_local_2;
  Database<DNA> *args_local_1;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *args_local;
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  *pWStack_10;
  int numWorkers_local;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_30 = args_2;
  args_local_2 = (SearchParams<DNA> *)args_1;
  args_local_1 = (Database<DNA> *)args;
  args_local._4_4_ = numWorkers;
  pWStack_10 = this;
  std::deque<std::thread,_std::allocator<std::thread>_>::deque
            ((deque<std::thread,_std::allocator<std::thread>_> *)this);
  std::condition_variable::condition_variable((condition_variable *)(this + 0x50));
  std::mutex::mutex((mutex *)(this + 0x80));
  std::atomic<bool>::atomic((atomic<bool> *)(this + 0xa8),false);
  std::atomic<int>::atomic((atomic<int> *)(this + 0xac),0);
  std::
  queue<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::allocator<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>
  ::
  queue<std::deque<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::allocator<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>,void>
            ((queue<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::allocator<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>
              *)(this + 0xb0));
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::deque((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
           *)(this + 0x110));
  if ((int)args_local._4_4_ < 1) {
    local_8c = std::thread::hardware_concurrency();
  }
  else {
    local_8c = args_local._4_4_;
  }
  local_40 = local_8c;
  for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
    local_58.this =
         (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)this;
    std::thread::
    thread<WorkerQueue<QueryDatabaseSearcherWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*,Database<DNA>const*,SearchParams<DNA>const&>::WorkerQueue(int,WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*,Database<DNA>const*,SearchParams<DNA>const&)::_lambda(WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*&&,Database<DNA>const*&&,SearchParams<DNA>const&)_1_,WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*&,Database<DNA>const*&,SearchParams<DNA>const&,void>
              (&local_50,&local_58,
               (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                **)&args_local_1,(Database<DNA> **)&args_local_2,local_30);
    std::deque<std::thread,_std::allocator<std::thread>_>::push_back
              ((deque<std::thread,_std::allocator<std::thread>_> *)this,&local_50);
    std::thread::~thread(&local_50);
  }
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }